

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

void __thiscall PixelToaster::UnixDisplay::pumpEvents(UnixDisplay *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  UnixDisplay *local_110;
  UnixDisplay *local_f8;
  Key local_dc;
  Key local_d8;
  Code local_d4;
  undefined1 local_d0 [4];
  int i;
  XEvent event;
  UnixDisplay *this_local;
  
  event.pad[0x17] = (long)this;
  while( true ) {
    while (iVar1 = XCheckWindowEvent(this->display_,this->window_,0xffffffffffffffff,local_d0),
          iVar1 != 0) {
      handleEvent(this,(XEvent *)local_d0);
    }
    iVar1 = XCheckTypedEvent(this->display_,0x21,local_d0);
    if (iVar1 == 0) break;
    handleEvent(this,(XEvent *)local_d0);
  }
  for (local_d4 = Undefined; (int)local_d4 < 0x100; local_d4 = local_d4 + 1) {
    if (((keyIsReleased_[(int)local_d4] & 1) == 0) || ((keyIsPressed_[(int)local_d4] & 1) == 0)) {
      if (((keyIsPressed_[(int)local_d4] & 1) != 0) &&
         (iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                            (), CONCAT44(extraout_var_02,iVar1) != 0)) {
        iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])()
        ;
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          ();
        local_110 = this;
        if (CONCAT44(extraout_var_04,iVar2) != 0) {
          uVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10]
                  )();
          local_110 = (UnixDisplay *)(ulong)uVar3;
        }
        Key::Key(&local_dc,local_d4);
        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x20))
                  ((long *)CONCAT44(extraout_var_03,iVar1),local_110,local_dc.code);
      }
    }
    else {
      iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])();
      if (CONCAT44(extraout_var,iVar1) != 0) {
        iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])()
        ;
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          ();
        local_f8 = this;
        if (CONCAT44(extraout_var_01,iVar2) != 0) {
          uVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10]
                  )();
          local_f8 = (UnixDisplay *)(ulong)uVar3;
        }
        Key::Key(&local_d8,local_d4);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                  ((long *)CONCAT44(extraout_var_00,iVar1),local_f8,local_d8.code);
      }
      keyIsPressed_[(int)local_d4] = 0;
      keyIsReleased_[(int)local_d4] = 0;
    }
  }
  return;
}

Assistant:

void pumpEvents()
    {
        ::XEvent event;
        while (true)
        {
            if (::XCheckWindowEvent(display_, window_, -1, &event))
            {
                handleEvent(event);
            }
            else if (::XCheckTypedEvent(display_, ClientMessage, &event))
            {
                handleEvent(event);
            }
            else
            {
                break;
            }
        }

        // send key press and up events

        for (int i = 0; i < keyMapSize_; ++i)
        {
            if (keyIsReleased_[i] && keyIsPressed_[i])
            {
                if (listener())
                    listener()->onKeyUp(wrapper() ? *wrapper() : *(DisplayInterface*)this, static_cast<Key::Code>(i));
                keyIsPressed_[i]  = false;
                keyIsReleased_[i] = false;
            }
            else if (keyIsPressed_[i])
            {
                if (listener())
                    listener()->onKeyPressed(wrapper() ? *wrapper() : *(DisplayInterface*)this, static_cast<Key::Code>(i));
            }
        }
    }